

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentCopyingContext.cpp
# Opt level: O2

EStatusCode __thiscall
PDFDocumentCopyingContext::Start
          (PDFDocumentCopyingContext *this,IByteReaderWithPosition *inPDFStream,
          DocumentContext *inDocumentContext,ObjectsContext *inObjectsContext,
          PDFParsingOptions *inOptions,IPDFParserExtender *inParserExtender)

{
  EStatusCode EVar1;
  PDFDocumentHandler *this_00;
  
  this->mDocumentContext = inDocumentContext;
  PDFHummus::DocumentContext::RegisterCopyingContext(inDocumentContext,this);
  this_00 = &this->mDocumentHandler;
  PDFDocumentHandler::SetOperationsContexts(this_00,inDocumentContext,inObjectsContext);
  EVar1 = PDFDocumentHandler::StartStreamCopyingContext(this_00,inPDFStream,inOptions);
  if (EVar1 == eSuccess) {
    PDFDocumentHandler::SetParserExtender(this_00,inParserExtender);
  }
  return EVar1;
}

Assistant:

EStatusCode PDFDocumentCopyingContext::Start(IByteReaderWithPosition* inPDFStream,
											 DocumentContext* inDocumentContext,
											 ObjectsContext* inObjectsContext,
											const PDFParsingOptions& inOptions,
											 IPDFParserExtender* inParserExtender)
{
	mDocumentContext = inDocumentContext;
	inDocumentContext->RegisterCopyingContext(this);
	mDocumentHandler.SetOperationsContexts(inDocumentContext,inObjectsContext);
	EStatusCode status = mDocumentHandler.StartStreamCopyingContext(inPDFStream, inOptions);
    if(eSuccess == status)
        mDocumentHandler.SetParserExtender(inParserExtender);
    return status;
}